

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::segment_headers(ostream *out,elfio *reader)

{
  Elf_Half no;
  elfio *peVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  segment *seg_00;
  string local_68 [32];
  section *local_48;
  section *sec;
  segment *psStack_38;
  Elf_Half j;
  segment *seg_1;
  segment *psStack_28;
  Elf_Half i_1;
  segment *seg;
  Elf_Half i;
  elfio *peStack_18;
  Elf_Half n;
  elfio *reader_local;
  ostream *out_local;
  
  peStack_18 = reader;
  reader_local = (elfio *)out;
  seg._6_2_ = elfio::Segments::size(&reader->segments);
  if (seg._6_2_ != 0) {
    poVar6 = std::operator<<((ostream *)reader_local,"Program Headers:");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    uVar2 = elfio::get_class(peStack_18);
    if (uVar2 == '\x01') {
      poVar6 = std::operator<<((ostream *)reader_local,
                               "[  Nr ] Type           VirtAddr   PhysAddr   FileSize   Mem.Size   Flags    Align"
                              );
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar6 = std::operator<<((ostream *)reader_local,
                               "[  Nr ] Type           Offset             VirtAddr           PhysAddr"
                              );
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,
                               "                       FileSize           MemSize             Flags  Align"
                              );
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    for (seg._4_2_ = 0; seg._4_2_ < seg._6_2_; seg._4_2_ = seg._4_2_ + 1) {
      seg_00 = elfio::Segments::operator[](&peStack_18->segments,(uint)seg._4_2_);
      peVar1 = reader_local;
      no = seg._4_2_;
      psStack_28 = seg_00;
      bVar3 = elfio::get_class(peStack_18);
      segment_header((ostream *)peVar1,no,seg_00,(uint)bVar3);
    }
    std::ostream::operator<<(reader_local,std::endl<char,std::char_traits<char>>);
    for (seg_1._6_2_ = 0; seg_1._6_2_ < seg._6_2_; seg_1._6_2_ = seg_1._6_2_ + 1) {
      poVar6 = std::operator<<((ostream *)reader_local,"[");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,seg_1._6_2_);
      poVar6 = std::operator<<(poVar6,"]");
      std::operator<<(poVar6," ");
      psStack_38 = elfio::Segments::operator[](&peStack_18->segments,(uint)seg_1._6_2_);
      for (sec._6_2_ = 0; uVar5 = (uint)sec._6_2_, uVar4 = (*psStack_38->_vptr_segment[0x16])(),
          peVar1 = peStack_18, uVar5 < (uVar4 & 0xffff); sec._6_2_ = sec._6_2_ + 1) {
        uVar5 = (*psStack_38->_vptr_segment[0x17])(psStack_38,(ulong)sec._6_2_);
        local_48 = elfio::Sections::operator[](&peVar1->sections,uVar5 & 0xffff);
        peVar1 = reader_local;
        (*local_48->_vptr_section[3])();
        poVar6 = std::operator<<((ostream *)peVar1,local_68);
        std::operator<<(poVar6," ");
        std::__cxx11::string::~string(local_68);
      }
      std::ostream::operator<<(reader_local,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<(reader_local,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

static void segment_headers( std::ostream& out, const elfio& reader )
    {
        Elf_Half n = reader.segments.size();
        if ( n == 0 ) {
            return;
        }

        out << "Program Headers:" << std::endl;
        if ( reader.get_class() == ELFCLASS32 ) { // Output for 32-bit
            out << "[  Nr ] Type           VirtAddr   PhysAddr   FileSize   "
                   "Mem.Size   Flags    Align"
                << std::endl;
        }
        else { // Output for 64-bit
            out << "[  Nr ] Type           Offset             VirtAddr         "
                   "  PhysAddr"

                << std::endl
                << "                       FileSize           MemSize          "
                   "   Flags  Align"
                << std::endl;
        }

        for ( Elf_Half i = 0; i < n; ++i ) {
            const segment* seg = reader.segments[i];
            segment_header( out, i, seg, reader.get_class() );
        }

        out << std::endl;
        for ( Elf_Half i = 0; i < n; ++i ) {
            out << "[" << i << "]" << " ";
            const segment* seg = reader.segments[i];
            for ( Elf_Half j = 0; j < seg->get_sections_num(); j++ ) {
                const section* sec =
                    reader.sections[seg->get_section_index_at( j )];
                out << sec->get_name() << " ";
            }
            out << std::endl;
        }

        out << std::endl;
    }